

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_dash.cpp
# Opt level: O2

void __thiscall agg::vcgen_dash::calc_dash_start(vcgen_dash *this,double ds)

{
  uint uVar1;
  
  this->m_curr_dash = 0;
  this->m_curr_dash_start = 0.0;
  uVar1 = 0;
  do {
    while( true ) {
      if (ds <= 0.0) {
        return;
      }
      if (this->m_dashes[uVar1] < ds) break;
      this->m_curr_dash_start = ds;
      ds = 0.0;
    }
    ds = ds - this->m_dashes[uVar1];
    uVar1 = uVar1 + 1;
    this->m_curr_dash = uVar1;
    this->m_curr_dash_start = 0.0;
    if (this->m_num_dashes <= uVar1) {
      this->m_curr_dash = 0;
      uVar1 = 0;
    }
  } while( true );
}

Assistant:

void vcgen_dash::calc_dash_start(double ds)
    {
        m_curr_dash = 0;
        m_curr_dash_start = 0.0;
        while(ds > 0.0)
        {
            if(ds > m_dashes[m_curr_dash])
            {
                ds -= m_dashes[m_curr_dash];
                ++m_curr_dash;
                m_curr_dash_start = 0.0;
                if(m_curr_dash >= m_num_dashes) m_curr_dash = 0;
            }
            else
            {
                m_curr_dash_start = ds;
                ds = 0.0;
            }
        }
    }